

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O3

bool __thiscall
google::protobuf::io::CodedInputStream::ReadString(CodedInputStream *this,string *buffer,int size)

{
  pointer __dest;
  bool bVar1;
  LogMessage *other;
  LogFinisher local_59;
  LogMessage local_58;
  
  if (size < 0) {
    bVar1 = false;
  }
  else {
    if (*(int *)&this->buffer_end_ - *(int *)&this->buffer_ < size) {
      bVar1 = ReadStringFallback(this,buffer,size);
      return bVar1;
    }
    std::__cxx11::string::resize((ulong)buffer,(char)size);
    __dest = (buffer->_M_dataplus)._M_p;
    if (__dest == (pointer)0x0) {
      internal::LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream.cc"
                 ,0x10b);
      other = internal::LogMessage::operator<<(&local_58,"CHECK failed: z.first != NULL: ");
      internal::LogFinisher::operator=(&local_59,other);
      internal::LogMessage::~LogMessage(&local_58);
    }
    memcpy(__dest,this->buffer_,(ulong)(uint)size);
    this->buffer_ = this->buffer_ + (uint)size;
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool CodedInputStream::ReadString(std::string* buffer, int size) {
  if (size < 0) return false;  // security: size is often user-supplied

  if (BufferSize() >= size) {
    STLStringResizeUninitialized(buffer, size);
    std::pair<char*, bool> z = as_string_data(buffer);
    if (z.second) {
      // Oddly enough, memcpy() requires its first two args to be non-NULL even
      // if we copy 0 bytes.  So, we have ensured that z.first is non-NULL here.
      GOOGLE_DCHECK(z.first != NULL);
      memcpy(z.first, buffer_, size);
      Advance(size);
    }
    return true;
  }

  return ReadStringFallback(buffer, size);
}